

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorExtend.cpp
# Opt level: O2

void __thiscall HFactor::addRows(HFactor *this,HighsSparseMatrix *ar_matrix)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<double,_std::allocator<double>_> *this_00;
  int *piVar2;
  int iVar3;
  HighsInt *pHVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  int iVar8;
  HighsInt iRow;
  long lVar9;
  int iVar10;
  uint uVar11;
  size_type sVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  HighsInt iRow_1;
  int iVar18;
  ulong uVar19;
  HighsInt iRow_2;
  int iVar20;
  ulong uVar21;
  HighsInt iX;
  ulong uVar22;
  double dVar23;
  HighsInt u_countX;
  vector<int,_std::allocator<int>_> ur_temp;
  vector<int,_std::allocator<int>_> in_basis;
  HighsSparseMatrix new_lr_cols;
  HighsSparseMatrix new_lr_rows;
  HVector rhs;
  double local_238;
  value_type_conflict2 local_220;
  int local_21c;
  ulong local_218;
  ulong local_210;
  _Vector_base<int,_std::allocator<int>_> local_208;
  size_type local_1f0;
  vector<int,_std::allocator<int>_> *local_1e8;
  ulong local_1e0;
  _Vector_base<int,_std::allocator<int>_> local_1d8;
  HighsSparseMatrix local_1c0;
  HighsSparseMatrix local_150;
  HVectorBase<double> local_e0;
  
  invalidAMatrixAction(this);
  uVar11 = ar_matrix->num_row_;
  local_210 = (ulong)(this->num_row + uVar11);
  printf("Adding %d new rows to HFactor instance: increasing dimension from %d to %d \n",
         (ulong)uVar11);
  local_1d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0.size = -1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            ((vector<int,_std::allocator<int>_> *)&local_1d8,(long)this->num_col,&local_e0.size);
  pHVar4 = this->basic_index;
  for (lVar9 = 0; lVar9 < this->num_row; lVar9 = lVar9 + 1) {
    if (pHVar4[lVar9] < this->num_col) {
      local_1d8._M_impl.super__Vector_impl_data._M_start[pHVar4[lVar9]] = (int)lVar9;
    }
  }
  HighsSparseMatrix::HighsSparseMatrix(&local_150);
  local_150.format_ = kRowwise;
  local_150.num_col_ = this->num_row;
  local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HVectorBase<double>::setup(&local_e0,local_150.num_col_);
  local_1e8 = &this->lr_start;
  local_1f0 = (size_type)((int)local_210 + 1);
  std::vector<int,_std::allocator<int>_>::reserve(local_1e8,local_1f0);
  local_1e0 = 0;
  if (0 < (int)uVar11) {
    local_1e0 = (ulong)uVar11;
  }
  local_238 = 0.0;
  uVar19 = 0;
  local_218 = (ulong)uVar11;
  while (uVar19 != local_1e0) {
    HVectorBase<double>::clear(&local_e0);
    local_e0.packFlag = true;
    piVar5 = (ar_matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = piVar5 + uVar19;
    uVar19 = uVar19 + 1;
    for (lVar9 = (long)*piVar2; lVar9 < piVar5[uVar19]; lVar9 = lVar9 + 1) {
      iVar20 = local_1d8._M_impl.super__Vector_impl_data._M_start
               [(ar_matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9]];
      if (-1 < (long)iVar20) {
        local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar20] =
             (ar_matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar9];
        lVar14 = (long)local_e0.count;
        local_e0.count = local_e0.count + 1;
        local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar14] = iVar20;
      }
    }
    btranU(this,&local_e0,local_238,(HighsTimerClock *)0x0);
    dVar23 = (double)local_e0.count;
    iVar20 = this->num_row;
    HVectorBase<double>::tight(&local_e0);
    local_238 = local_238 * 0.95 + (dVar23 / (double)iVar20) * 0.05;
    uVar11 = local_e0.count;
    if (local_e0.count < 1) {
      uVar11 = 0;
    }
    for (uVar22 = 0; uVar11 != uVar22; uVar22 = uVar22 + 1) {
      local_1c0.format_ =
           local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar22];
      std::vector<int,_std::allocator<int>_>::push_back
                (&local_150.index_,(value_type_conflict2 *)&local_1c0);
      std::vector<double,_std::allocator<double>_>::push_back
                (&local_150.value_,
                 local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)local_1c0.format_);
    }
    local_1c0.format_ =
         (MatrixFormat)
         ((ulong)((long)local_150.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_150.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&local_150.start_,(int *)&local_1c0);
    local_150.num_row_ = local_150.num_row_ + 1;
    for (uVar22 = 0; uVar11 != uVar22; uVar22 = uVar22 + 1) {
      local_1c0.format_ =
           local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar22];
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->lr_index,(value_type_conflict2 *)&local_1c0);
      std::vector<double,_std::allocator<double>_>::push_back
                (&this->lr_value,
                 local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)local_1c0.format_);
    }
    local_1c0.format_ =
         (MatrixFormat)
         ((ulong)((long)(this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_1e8,(int *)&local_1c0);
  }
  HighsSparseMatrix::HighsSparseMatrix(&local_1c0,&local_150);
  HighsSparseMatrix::ensureColwise(&local_1c0);
  sVar12 = (size_type)(int)local_210;
  std::vector<int,_std::allocator<int>_>::resize(&this->l_pivot_index,sVar12);
  piVar5 = (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar9 = (long)this->num_row; lVar9 < (long)sVar12; lVar9 = lVar9 + 1) {
    piVar5[lVar9] = (int)lVar9;
  }
  piVar5 = (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar6 = (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<int,_std::allocator<int>_>::resize(&this->l_start,local_1f0);
  uVar19 = (ulong)((long)piVar5 - (long)piVar6) >> 2;
  piVar5 = (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar9 = (long)this->num_row; iVar20 = (int)uVar19, lVar9 < (long)sVar12; lVar9 = lVar9 + 1) {
    piVar5[lVar9 + 1] = iVar20;
  }
  pvVar1 = &this->l_index;
  std::vector<int,_std::allocator<int>_>::resize(pvVar1,(long)iVar20);
  this_00 = &this->l_value;
  std::vector<double,_std::allocator<double>_>::resize(this_00,(long)iVar20);
  piVar5 = (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar22 = (ulong)(uint)this->num_row;
  while (0 < (int)uVar22) {
    uVar21 = uVar22 - 1;
    lVar13 = (long)piVar5[uVar22];
    iVar20 = (int)uVar19;
    piVar5[uVar22] = iVar20;
    lVar17 = (long)local_1c0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar22];
    lVar15 = (long)iVar20;
    lVar9 = lVar15 * 4;
    piVar6 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    lVar14 = lVar15 * 8;
    pdVar7 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar16 = 0; lVar14 = lVar14 + -8, lVar9 = lVar9 + -4,
        (long)local_1c0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar21] < lVar17 + lVar16; lVar16 = lVar16 + -1) {
      piVar6[lVar15 + lVar16 + -1] =
           local_1c0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar17 + lVar16 + -1] + this->num_row;
      pdVar7[lVar15 + lVar16 + -1] =
           local_1c0.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar17 + lVar16 + -1];
    }
    piVar6 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    pdVar7 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar15 = 0; (long)piVar5[uVar21] < lVar13 + lVar15; lVar15 = lVar15 + -1) {
      *(int *)((long)piVar6 + lVar15 * 4 + lVar9) = piVar6[lVar13 + lVar15 + -1];
      *(double *)((long)pdVar7 + lVar15 * 8 + lVar14) = pdVar7[lVar13 + lVar15 + -1];
    }
    uVar19 = (ulong)(uint)((int)lVar15 + iVar20 + (int)lVar16);
    uVar22 = uVar21;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->l_pivot_lookup,sVar12);
  piVar5 = (this->l_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar9 = (long)this->num_row; lVar9 < (long)sVar12; lVar9 = lVar9 + 1) {
    piVar5[piVar6[lVar9]] = (int)lVar9;
  }
  local_21c = (int)((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_220 = this->num_row;
  iVar20 = (int)((ulong)((long)(this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2) - local_220;
  for (; local_220 < (int)local_210; local_220 = local_220 + 1) {
    local_208._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_208._M_impl.super__Vector_impl_data._M_start._4_4_,
                           local_220 + iVar20);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->u_pivot_lookup,(int *)&local_208);
    std::vector<int,_std::allocator<int>_>::push_back(&this->u_pivot_index,&local_220);
    local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->u_pivot_value,(double *)&local_208);
    std::vector<int,_std::allocator<int>_>::push_back(&this->u_start,&local_21c);
    std::vector<int,_std::allocator<int>_>::push_back(&this->u_last_p,&local_21c);
  }
  iVar20 = (uint)(this->update_method == 1) * 5;
  uVar22 = (ulong)((long)(this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  iVar10 = (int)uVar22;
  iVar18 = iVar20 * (int)local_218 + iVar10;
  std::vector<int,_std::allocator<int>_>::resize(&this->ur_index,(long)iVar18);
  std::vector<double,_std::allocator<double>_>::resize(&this->ur_value,(long)iVar18);
  uVar19 = (long)(this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  pvVar1 = &this->ur_start;
  uVar21 = uVar19 >> 2;
  iVar3 = (int)local_218;
  iVar8 = (int)uVar21;
  printf("\nUpdating UR vectors %d - %d\n",uVar21 & 0xffffffff,(ulong)((iVar3 + iVar8) - 1));
  std::vector<int,_std::allocator<int>_>::resize(pvVar1,(long)(iVar3 + iVar8 + 1));
  piVar5 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar9 = uVar19 * 0x40000000;
  sVar12 = (size_type)(iVar3 + iVar8);
  uVar21 = lVar9 + 0x100000000 >> 0x20;
  for (uVar19 = uVar21; (long)uVar19 <= (long)sVar12; uVar19 = uVar19 + 1) {
    piVar5[uVar19] = iVar10;
  }
  local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_220 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            ((vector<int,_std::allocator<int>_> *)&local_208,sVar12,&local_220);
  std::vector<int,_std::allocator<int>_>::resize(&this->ur_space,sVar12);
  piVar5 = (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = (long)iVar8;
  for (lVar14 = lVar13; lVar14 < (long)sVar12; lVar14 = lVar14 + 1) {
    piVar5[lVar14] = iVar20;
  }
  piVar5 = (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar14 = 0; lVar14 < local_21c; lVar14 = lVar14 + 1) {
    local_208._M_impl.super__Vector_impl_data._M_start[piVar5[piVar6[lVar14]]] =
         local_208._M_impl.super__Vector_impl_data._M_start[piVar5[piVar6[lVar14]]] + 1;
  }
  *(int *)((long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start + (lVar9 >> 0x1e)) = iVar10;
  for (; (long)uVar21 <= (long)sVar12; uVar21 = uVar21 + 1) {
    iVar3 = local_208._M_impl.super__Vector_impl_data._M_start[uVar21 - 1];
    uVar11 = (int)uVar22 + iVar3 + iVar20;
    uVar22 = (ulong)uVar11;
    (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
    [uVar21] = uVar11;
    printf("ur_start[%d] = %d; gap = %d; iStart = %d\n",uVar21 & 0xffffffff,(ulong)uVar11,
           (ulong)(uint)(iVar3 + iVar20),(ulong)uVar11);
  }
  printf("ur_count_size = %d; iStart%d\n",iVar18,uVar22 & 0xffffffff);
  std::vector<int,_std::allocator<int>_>::resize(pvVar1,sVar12);
  std::vector<int,_std::allocator<int>_>::resize(&this->ur_lastp,sVar12);
  piVar5 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar6 = (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (; lVar13 < (long)sVar12; lVar13 = lVar13 + 1) {
    piVar6[lVar13] = piVar5[lVar13];
  }
  this->num_row = this->num_row + (int)local_218;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_208);
  HighsSparseMatrix::~HighsSparseMatrix(&local_1c0);
  HVectorBase<double>::~HVectorBase(&local_e0);
  HighsSparseMatrix::~HighsSparseMatrix(&local_150);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1d8);
  return;
}

Assistant:

void HFactor::addRows(const HighsSparseMatrix* ar_matrix) {
  invalidAMatrixAction();
  assert(kExtendInvertWhenAddingRows);
  HighsInt num_new_row = ar_matrix->num_row_;
  HighsInt new_num_row = num_row + num_new_row;
  printf("Adding %" HIGHSINT_FORMAT
         " new rows to HFactor instance: increasing dimension from "
         "%" HIGHSINT_FORMAT " to %" HIGHSINT_FORMAT " \n",
         num_new_row, num_row, new_num_row);

  // Need to know where (if) a column is basic
  vector<HighsInt> in_basis;
  in_basis.assign(num_col, -1);
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt iVar = basic_index[iRow];
    if (iVar < num_col) in_basis[iVar] = iRow;
  }
  for (HighsInt iRow = num_row; iRow < new_num_row; iRow++) {
    HighsInt iVar = basic_index[iRow];
    assert(iVar >= num_col);
  }
  //  reportLu(kReportLuBoth, true);
  //  reportLu(kReportLuJustL);

  // Create a row-wise sparse matrix containing the new rows of the L
  // matrix - so that a column-wise version can be created (after
  // inserting the rows into the LR matrix) allowing the cew column
  // entries to be inserted efficiently into the L matrix
  HighsSparseMatrix new_lr_rows;
  new_lr_rows.format_ = MatrixFormat::kRowwise;
  new_lr_rows.num_col_ = num_row;
  double expected_density = 0.0;
  HVector rhs;
  rhs.setup(num_row);
  this->lr_start.reserve(new_num_row + 1);
  for (HighsInt inewRow = 0; inewRow < num_new_row; inewRow++) {
    //    printf("\nFor new row %" HIGHSINT_FORMAT "\n", inewRow);
    // Prepare RHS for system U^T.v = r
    rhs.clear();
    rhs.packFlag = true;
    for (HighsInt iEl = ar_matrix->start_[inewRow];
         iEl < ar_matrix->start_[inewRow + 1]; iEl++) {
      HighsInt iCol = ar_matrix->index_[iEl];
      HighsInt basis_index = in_basis[iCol];
      if (basis_index >= 0) {
        rhs.array[basis_index] = ar_matrix->value_[iEl];
        rhs.index[rhs.count++] = basis_index;
      }
    }
    // Solve U^T.v = r
    btranU(rhs, expected_density);
    double local_density = (1.0 * rhs.count) / num_row;
    expected_density = kRunningAverageMultiplier * local_density +
                       (1 - kRunningAverageMultiplier) * expected_density;
    //    printf("New row btranU density: local = %11.4g; expected =  %11.4g\n",
    //    local_density, expected_density);
    rhs.tight();
    //
    // Append v to the matrix containing the new rows of L
    HighsInt rhs_num_nz = rhs.count;
    //    printf("New row has entries:\n");
    for (HighsInt iX = 0; iX < rhs_num_nz; iX++) {
      HighsInt iCol = rhs.index[iX];
      new_lr_rows.index_.push_back(iCol);
      new_lr_rows.value_.push_back(rhs.array[iCol]);
      //      printf("   %4d, %11.4g\n", (int)iCol, rhs.array[iCol]);
    }
    new_lr_rows.start_.push_back(new_lr_rows.index_.size());
    new_lr_rows.num_row_++;

    //
    // Append v to the L matrix
    for (HighsInt iX = 0; iX < rhs_num_nz; iX++) {
      HighsInt iCol = rhs.index[iX];
      lr_index.push_back(iCol);
      lr_value.push_back(rhs.array[iCol]);
    }
    lr_start.push_back(lr_index.size());
    //    reportLu(kReportLuJustL);
  }
  // Now create a column-wise copy of the new rows
  HighsSparseMatrix new_lr_cols = new_lr_rows;
  new_lr_cols.ensureColwise();
  //
  // Insert the column-wise copy into the L matrix
  //
  // Add pivot indices for the new columns
  this->l_pivot_index.resize(new_num_row);
  for (HighsInt iCol = num_row; iCol < new_num_row; iCol++)
    l_pivot_index[iCol] = iCol;
  //
  // Add starts for the identity columns
  HighsInt l_matrix_new_num_nz = lr_index.size();
  assert(l_matrix_new_num_nz ==
         (HighsInt)(l_index.size() + new_lr_cols.index_.size()));
  l_start.resize(new_num_row + 1);
  HighsInt to_el = l_matrix_new_num_nz;
  for (HighsInt iCol = num_row + 1; iCol < new_num_row + 1; iCol++)
    l_start[iCol] = l_matrix_new_num_nz;
  //
  // Insert the new entries, remembering to offset the index values by
  // num_row, since new_lr_cols only has the new rows
  l_index.resize(l_matrix_new_num_nz);
  l_value.resize(l_matrix_new_num_nz);
  for (HighsInt iCol = num_row - 1; iCol >= 0; iCol--) {
    const HighsInt from_el = l_start[iCol + 1];
    l_start[iCol + 1] = to_el;
    for (HighsInt iEl = new_lr_cols.start_[iCol + 1] - 1;
         iEl >= new_lr_cols.start_[iCol]; iEl--) {
      to_el--;
      l_index[to_el] = num_row + new_lr_cols.index_[iEl];
      l_value[to_el] = new_lr_cols.value_[iEl];
    }
    for (HighsInt iEl = from_el - 1; iEl >= l_start[iCol]; iEl--) {
      to_el--;
      l_index[to_el] = l_index[iEl];
      l_value[to_el] = l_value[iEl];
    }
  }
  assert(to_el == 0);
  this->l_pivot_lookup.resize(new_num_row);
  for (HighsInt iRow = num_row; iRow < new_num_row; iRow++)
    l_pivot_lookup[l_pivot_index[iRow]] = iRow;
  // Now update the U matrix with identity rows and columns
  // Allocate space for U factor
  //  reportLu(kReportLuJustL);
  //
  // Now add pivots corresponding to identity columns in U. The use of
  // most arrays in U is self-evident, except for U(R)lastp, which is
  // (one more than) the end of the index/value array that's applied
  // in the *tranU. Here it needs to be equal to the start since there
  // are no non-pivotal entries
  //

  HighsInt u_countX = u_index.size();
  HighsInt u_pivot_lookup_offset = u_pivot_index.size() - num_row;
  for (HighsInt iRow = num_row; iRow < new_num_row; iRow++) {
    u_pivot_lookup.push_back(u_pivot_lookup_offset + iRow);
    u_pivot_index.push_back(iRow);
    u_pivot_value.push_back(1);
    u_start.push_back(u_countX);
    u_last_p.push_back(u_countX);
  }

  // Now, to extend UR
  //
  // UR space
  //
  // Borrowing names from buildFinish()
  HighsInt ur_stuff_size = update_method == kUpdateMethodFt ? 5 : 0;
  HighsInt ur_size = ur_index.size();
  HighsInt ur_count_size = ur_size + ur_stuff_size * num_new_row;
  ur_index.resize(ur_count_size);
  ur_value.resize(ur_count_size);

  // Need to refer to just the new UR vectors
  HighsInt ur_cur_num_vec = ur_start.size();
  HighsInt ur_new_num_vec = ur_cur_num_vec + num_new_row;
  printf("\nUpdating UR vectors %d - %d\n", (int)ur_cur_num_vec,
         (int)ur_new_num_vec - 1);
  // UR pointer
  //
  // Allow space to the start of new rows, including the start for the
  // fictitious ur_new_num_vec'th row
  ur_start.resize(ur_new_num_vec + 1);
  for (HighsInt iRow = ur_cur_num_vec + 1; iRow < ur_new_num_vec + 1; iRow++) {
    ur_start[iRow] = ur_size;
  }
  // NB ur_temp plays the role of ur_lastp when it could be used as
  // temporary storage in buildFinish()
  vector<HighsInt> ur_temp;
  ur_temp.assign(ur_new_num_vec, 0);
  //
  // ur_space has its new entries assigned (to ur_stuff_size) as in
  // buildFinish()
  ur_space.resize(ur_new_num_vec);
  for (HighsInt iRow = ur_cur_num_vec; iRow < ur_new_num_vec; iRow++)
    ur_space[iRow] = ur_stuff_size;
  // Compute ur_temp exactly as in buildFinish()
  for (HighsInt k = 0; k < u_countX; k++) ur_temp[u_pivot_lookup[u_index[k]]]++;
  HighsInt iStart = ur_size;
  ur_start[ur_cur_num_vec] = iStart;
  for (HighsInt iRow = ur_cur_num_vec + 1; iRow < ur_new_num_vec + 1; iRow++) {
    HighsInt gap = ur_temp[iRow - 1] + ur_stuff_size;
    ur_start[iRow] = iStart + gap;
    iStart += gap;
    printf("ur_start[%d] = %d; gap = %d; iStart = %d\n", (int)iRow,
           (int)ur_start[iRow], (int)gap, (int)iStart);
  }
  printf("ur_count_size = %d; iStart%d\n", (int)ur_count_size, (int)iStart);
  // Lose the start for the fictitious ur_new_num_vec'th row
  ur_start.resize(ur_new_num_vec);
  // Resize ur_lastp and initialise its new entries to be the ur_start
  // values since the rows are empty
  ur_lastp.resize(ur_new_num_vec);
  for (HighsInt iRow = ur_cur_num_vec; iRow < ur_new_num_vec; iRow++)
    ur_lastp[iRow] = ur_start[iRow];
  //
  // Increase the number of rows in HFactor
  num_row += num_new_row;
  //  reportLu(kReportLuBoth, true);
}